

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * BN::makeRandom(BN *__return_storage_ptr__,size_t byteCount)

{
  int iVar1;
  iterator __begin2;
  pointer puVar2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> result;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_30;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,byteCount >> 1,
             (allocator_type *)&local_30);
  puVar2 = local_48._M_impl.super__Vector_impl_data._M_start;
  if (local_48._M_impl.super__Vector_impl_data._M_start ==
      local_48._M_impl.super__Vector_impl_data._M_finish) {
    local_30._M_impl.super__Vector_impl_data._M_start._0_4_ = rand();
    local_30._M_impl.super__Vector_impl_data._M_start._0_4_ =
         (uint)local_30._M_impl.super__Vector_impl_data._M_start & 0xffff;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::emplace_back<int>
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48,(int *)&local_30
              );
  }
  else {
    for (; puVar2 != local_48._M_impl.super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
      iVar1 = rand();
      *puVar2 = (unsigned_short)iVar1;
    }
  }
  BN((BN *)&local_30,(vector<unsigned_short,_std::allocator<unsigned_short>_> *)&local_48);
  BN(__return_storage_ptr__,(BN *)&local_30);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_30);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

BN BN::makeRandom(size_t byteCount) {
    vector<bt> result(byteCount / bz);
    if (result.empty())
        result.emplace_back(rand() & bmax);
    else
        for (auto& i : result)
            i = rand() & bmax;
    return move(BN(move(result)));
}